

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprog.c
# Opt level: O1

void speech_prog_ruins_mouth(CHAR_DATA *mob,CHAR_DATA *ch,char *speech)

{
  char *pcVar1;
  ROOM_INDEX_DATA *pRoomIndex;
  
  pcVar1 = strstr(speech,"testing");
  if (pcVar1 == (char *)0x0) {
    pcVar1 = strstr(speech,"Testing");
    if (pcVar1 == (char *)0x0) {
      pcVar1 = strstr(speech,"office");
      if (pcVar1 == (char *)0x0) {
        pcVar1 = strstr(speech,"Office");
        if (pcVar1 == (char *)0x0) {
          pcVar1 = strstr(speech,"inventory");
          if (pcVar1 == (char *)0x0) {
            pcVar1 = strstr(speech,"Inventory");
            if (pcVar1 == (char *)0x0) {
              pRoomIndex = (ROOM_INDEX_DATA *)0x0;
              goto LAB_002ea524;
            }
          }
        }
      }
    }
  }
  pRoomIndex = get_room_index(0);
LAB_002ea524:
  if (pRoomIndex != (ROOM_INDEX_DATA *)0x0) {
    send_to_char("A magic mouth impossibly beckons for you to follow and strange magicks force you through the shimmering portal.\n\r"
                 ,ch);
    act("The magic mouth impossibly beckons for $n to follow and $e vanishes into the portal.",ch,
        (void *)0x0,(void *)0x0,0);
    char_from_room(ch);
    char_to_room(ch,pRoomIndex);
    do_look(ch,"auto");
    return;
  }
  return;
}

Assistant:

void speech_prog_ruins_mouth(CHAR_DATA *mob, CHAR_DATA *ch, char *speech)
{
	ROOM_INDEX_DATA *to_room = nullptr;

	if (strstr(speech, "testing") || strstr(speech, "Testing"))
		to_room = get_room_index(20159);
	else if (strstr(speech, "office") || strstr(speech, "Office"))
		to_room = get_room_index(20158);
	else if (strstr(speech, "inventory") || strstr(speech, "Inventory"))
		to_room = get_room_index(20161);

	if (!to_room)
		return;

	send_to_char("A magic mouth impossibly beckons for you to follow and strange magicks force you through the shimmering portal.\n\r", ch);
	act("The magic mouth impossibly beckons for $n to follow and $e vanishes into the portal.", ch, 0, 0, TO_ROOM);

	char_from_room(ch);
	char_to_room(ch, to_room);
	do_look(ch, "auto");
}